

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

int __thiscall
TPZMatrix<TFad<6,_double>_>::Subst_Forward
          (TPZMatrix<TFad<6,_double>_> *this,TPZFMatrix<TFad<6,_double>_> *B)

{
  TFad<6,_double> *e2;
  TFad<6,_double> *pTVar1;
  long lVar2;
  int64_t iVar3;
  TPZBaseMatrix *in_RSI;
  TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMinus<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>
  *in_RDI;
  int64_t i;
  TFad<6,_double> sum;
  int64_t c;
  TFad<6,_double> pivot;
  int64_t r;
  TPZBaseMatrix *in_stack_fffffffffffffdc8;
  TFad<6,_double> *in_stack_fffffffffffffdd0;
  TFad<6,_double> *in_stack_fffffffffffffdd8;
  TFad<6,_double> *in_stack_fffffffffffffe08;
  undefined1 local_198 [64];
  undefined1 local_158 [64];
  undefined1 local_118 [80];
  long local_c8;
  undefined8 local_c0;
  TFad<6,_double> *local_68;
  undefined1 local_60 [64];
  TFad<6,_double> *local_20;
  TPZBaseMatrix *local_18;
  int local_4;
  
  local_18 = in_RSI;
  e2 = (TFad<6,_double> *)TPZBaseMatrix::Rows(in_RSI);
  pTVar1 = (TFad<6,_double> *)(*(code *)(in_RDI->fadexpr_).left_[6].fadexpr_.left_)();
  if (((e2 == pTVar1) && (*(char *)&in_RDI[1].fadexpr_.right_ != '\0')) &&
     (*(char *)&in_RDI[1].fadexpr_.right_ == '\x03')) {
    local_20 = (TFad<6,_double> *)0x0;
    while( true ) {
      pTVar1 = local_20;
      lVar2 = (*(code *)(in_RDI->fadexpr_).left_[6].fadexpr_.left_)();
      if (lVar2 <= (long)pTVar1) break;
      (*(code *)(in_RDI->fadexpr_).left_[0x12].fadexpr_.left_)(local_60,in_RDI,local_20,local_20);
      local_68 = (TFad<6,_double> *)0x0;
      while( true ) {
        pTVar1 = local_68;
        iVar3 = TPZBaseMatrix::Cols(local_18);
        if (iVar3 <= (long)pTVar1) break;
        local_c0 = 0;
        TFad<6,_double>::TFad(in_stack_fffffffffffffdd0,(double *)in_stack_fffffffffffffdc8);
        for (local_c8 = 0; local_c8 < (long)local_20; local_c8 = local_c8 + 1) {
          (*(code *)(in_RDI->fadexpr_).left_[0x12].fadexpr_.left_)
                    (local_118,in_RDI,local_20,local_c8);
          (*(local_18->super_TPZSavable)._vptr_TPZSavable[0x24])
                    (local_158,local_18,local_c8,local_68);
          ::operator*(in_stack_fffffffffffffe08,e2);
          TFad<6,double>::operator+=
                    (pTVar1,(TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)
                            in_stack_fffffffffffffdd8);
          TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
                    ((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)0x13191c3);
          TFad<6,_double>::~TFad((TFad<6,_double> *)0x13191d0);
          TFad<6,_double>::~TFad((TFad<6,_double> *)0x13191dd);
        }
        in_stack_fffffffffffffdc8 = local_18;
        in_stack_fffffffffffffdd0 = local_20;
        in_stack_fffffffffffffdd8 = local_68;
        (*(local_18->super_TPZSavable)._vptr_TPZSavable[0x24])(&stack0xfffffffffffffe08);
        ::operator-(in_stack_fffffffffffffe08,e2);
        ::operator/((TFadExpr<TFadBinaryMinus<TFad<6,_double>,_TFad<6,_double>_>_> *)
                    in_stack_fffffffffffffe08,e2);
        TFad<6,double>::
        TFad<TFadBinaryDiv<TFadExpr<TFadBinaryMinus<TFad<6,double>,TFad<6,double>>>,TFad<6,double>>>
                  (e2,in_RDI);
        (*(in_stack_fffffffffffffdc8->super_TPZSavable)._vptr_TPZSavable[0x23])
                  (in_stack_fffffffffffffdc8,in_stack_fffffffffffffdd0,in_stack_fffffffffffffdd8,
                   local_198);
        TFad<6,_double>::~TFad((TFad<6,_double> *)0x1319350);
        TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMinus<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>
        ::~TFadExpr((TFadExpr<TFadBinaryDiv<TFadExpr<TFadBinaryMinus<TFad<6,_double>,_TFad<6,_double>_>_>,_TFad<6,_double>_>_>
                     *)0x131935d);
        TFadExpr<TFadBinaryMinus<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
                  ((TFadExpr<TFadBinaryMinus<TFad<6,_double>,_TFad<6,_double>_>_> *)0x131936a);
        TFad<6,_double>::~TFad((TFad<6,_double> *)0x1319374);
        TFad<6,_double>::~TFad((TFad<6,_double> *)0x1319381);
        local_68 = (TFad<6,_double> *)
                   ((long)&((TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_> *)
                           &local_68->super_TPZSavable)->left_ + 1);
      }
      TFad<6,_double>::~TFad((TFad<6,_double> *)0x131943d);
      local_20 = (TFad<6,_double> *)((long)&(local_20->super_TPZSavable)._vptr_TPZSavable + 1);
    }
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int TPZMatrix<TVar>::Subst_Forward( TPZFMatrix<TVar> *B ) const {
	if ( (B->Rows() != Dim()) || !fDecomposed || fDecomposed != ECholesky)
		return( 0 );
	for ( int64_t r = 0; r < Dim(); r++ ) {
		TVar pivot = GetVal( r, r );
		for ( int64_t c = 0; c < B->Cols();  c++ ) {
			// Faz sum = SOMA( A[r,i] * B[i,c] ); i = 0, ..., r-1.
			//
			TVar sum = 0.0;
			for ( int64_t i = 0; i < r; i++ ) sum += GetVal(r, i) * B->GetVal(i, c);
			
			// Faz B[r,c] = (B[r,c] - sum) / A[r,r].
			//
			B->PutVal( r, c, (B->GetVal(r, c) - sum) / pivot );
		}
	}
	return( 1 );
}